

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase267::run(TestCase267 *this)

{
  word **this_00;
  bool bVar1;
  Orphan<capnp::Text> *value;
  ReaderFor<capnp::Text> RVar2;
  undefined1 local_1d8 [8];
  Builder root;
  bool local_199;
  undefined1 auStack_198 [7];
  bool _kj_shouldLog;
  size_t local_190;
  char (*local_188) [9];
  undefined1 local_180 [8];
  DebugComparison<const_char_(&)[9],_capnp::Text::Reader> _kjCondition;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder builder;
  TestCase267 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Text::Reader::Reader((Reader *)&_kjCondition.result,"foobarba");
  Orphanage::newOrphanCopy<capnp::Text::Reader>
            ((Orphan<capnp::Text> *)local_120,&local_130,(Reader)stack0xfffffffffffffeb0);
  local_188 = (char (*) [9])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [9])"foobarba");
  _auStack_198 = (ArrayPtr<const_char>)
                 Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_120);
  kj::_::DebugExpression<char_const(&)[9]>::operator==
            ((DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)local_180,
             (DebugExpression<char_const(&)[9]> *)&local_188,(Reader *)auStack_198);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      RVar2 = Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_120);
      root._builder._32_8_ = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Reader>&,char_const(&)[9],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x10f,ERROR,
                 "\"failed: expected \" \"(\\\"foobarba\\\") == (orphan.getReader())\", _kjCondition, \"foobarba\", orphan.getReader()"
                 ,(char (*) [54])"failed: expected (\"foobarba\") == (orphan.getReader())",
                 (DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)local_180,
                 (char (*) [9])"foobarba",(Reader *)&root._builder.dataSize);
      local_199 = false;
    }
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_1d8,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::Text>>((Orphan<capnp::Text> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField((Builder *)local_1d8,value);
  Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, OrphanageTextCopy) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphanCopy(Text::Reader("foobarba"));
  EXPECT_EQ("foobarba", orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
}